

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O0

void re::math::normalize<float,256l,256l>(span<const_float,_256L> in,span<float,_256L> out)

{
  iterator iVar1;
  span_iterator<gsl::span<const_float,_256L>,_false> local_90;
  float local_7c;
  span<float,_256L> local_78 [2];
  span_iterator<gsl::span<float,_256L>,_false> local_68;
  span_iterator<gsl::span<const_float,_256L>,_false> local_58;
  span<const_float,_256L> local_40 [2];
  span<const_float,_256L> local_30 [2];
  anon_class_4_1_ba1d79ab local_1c;
  storage_type<gsl::details::extent_type<256L>_> sStack_18;
  float sum;
  span<float,_256L> out_local;
  span<const_float,_256L> in_local;
  
  sStack_18 = out.storage_.data_;
  out_local.storage_.data_ =
       (storage_type<gsl::details::extent_type<256L>_>)
       (storage_type<gsl::details::extent_type<256L>_>)in.storage_.data_;
  ::std::cbegin<gsl::span<float_const,256l>>(local_30);
  iVar1 = ::std::cend<gsl::span<float_const,256l>>(local_40);
  local_1c.sum = ::std::
                 accumulate<gsl::details::span_iterator<gsl::span<float_const,256l>,false>,float,re::math::normalize<float,256l,256l>(gsl::span<float_const,256l>,gsl::span<float,256l>)::_lambda(auto:1,auto:2)_1_>
                           (local_30,local_40,iVar1.index_);
  if (0.0 <= local_1c.sum) {
    ::std::cbegin<gsl::span<float_const,256l>>((span<const_float,_256L> *)&local_58);
    ::std::cend<gsl::span<float_const,256l>>((span<const_float,_256L> *)&local_68);
    ::std::begin<gsl::span<float,256l>>(local_78);
    local_7c = local_1c.sum;
    ::std::
    transform<gsl::details::span_iterator<gsl::span<float_const,256l>,false>,gsl::details::span_iterator<gsl::span<float,256l>,false>,re::math::normalize<float,256l,256l>(gsl::span<float_const,256l>,gsl::span<float,256l>)::_lambda(auto:1)_1_>
              (&local_90,&local_58,&local_68,local_1c);
    return;
  }
  __assert_fail("sum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                ,0x1a,
                "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = 256L, N_out = 256L]"
               );
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}